

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O3

REF_STATUS ref_inflate_extend_rail(REF_INT *n,REF_DBL *x,REF_DBL *yz,REF_DBL *phi)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined8 uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  
  uVar11 = *n;
  if (1 < (int)uVar11) {
    uVar14 = (ulong)(uVar11 - 1);
    dVar15 = x[uVar14];
    dVar18 = *x;
    dVar3 = x[1];
    dVar6 = *yz;
    dVar7 = yz[1];
    dVar8 = yz[2];
    dVar9 = yz[3];
    dVar4 = *phi;
    dVar5 = phi[1];
    lVar12 = 0;
    do {
      *(undefined8 *)((long)x + lVar12 + uVar14 * 8 + 8) =
           *(undefined8 *)((long)x + lVar12 + uVar14 * 8);
      puVar2 = (undefined8 *)((long)yz + lVar12 * 2 + uVar14 * 0x10);
      uVar10 = puVar2[1];
      puVar1 = (undefined8 *)((long)yz + lVar12 * 2 + uVar14 * 0x10 + 0x10);
      *puVar1 = *puVar2;
      puVar1[1] = uVar10;
      *(undefined8 *)((long)phi + lVar12 + uVar14 * 8 + 8) =
           *(undefined8 *)((long)phi + lVar12 + uVar14 * 8);
      lVar12 = lVar12 + -8;
    } while (uVar14 * 8 + 8 + lVar12 != 0);
    iVar13 = uVar11 + 1;
    *n = iVar13;
    dVar15 = (dVar15 - dVar18) * 0.25;
    *x = x[1] - dVar15;
    dVar18 = dVar15 / (dVar3 - dVar18);
    *yz = yz[2] - dVar18 * (dVar8 - dVar6);
    yz[1] = yz[3] - dVar18 * (dVar9 - dVar7);
    *phi = phi[1] - (dVar5 - dVar4) * dVar18;
    dVar18 = x[uVar11] - x[(ulong)uVar11 - 1];
    auVar16._0_8_ = dVar18 * 1e+20;
    auVar16._8_8_ = dVar15;
    auVar17._8_8_ = -dVar15;
    auVar17._0_8_ = -auVar16._0_8_;
    auVar17 = maxpd(auVar16,auVar17);
    if (auVar17._8_8_ < auVar17._0_8_) {
      x[(ulong)uVar11 + 1] = x[uVar11] + dVar15;
      dVar15 = dVar15 / dVar18;
      dVar18 = yz[iVar13 * 2 + -2];
      dVar3 = (yz + (iVar13 * 2 + -2))[1];
      dVar4 = (yz + (iVar13 * 2 + -4))[1];
      yz[iVar13 * 2] = dVar15 * (dVar18 - yz[iVar13 * 2 + -4]) + dVar18;
      (yz + iVar13 * 2)[1] = dVar15 * (dVar3 - dVar4) + dVar3;
      phi[(ulong)uVar11 + 1] = (phi[uVar11] - phi[(ulong)uVar11 - 1]) * dVar15 + phi[uVar11];
      uVar11 = uVar11 + 2;
      *n = uVar11;
    }
  }
  return uVar11;
}

Assistant:

REF_FCN static REF_STATUS ref_inflate_extend_rail(REF_INT *n, REF_DBL *x,
                                                  REF_DBL *yz, REF_DBL *phi) {
  REF_DBL dx, l, dy, dz, dp;
  REF_INT i;
  if (2 > *n) return REF_SUCCESS;

  l = x[(*n) - 1] - x[0];
  l = 0.25 * l;

  dx = x[1] - x[0];
  dy = yz[0 + 2 * 1] - yz[0 + 2 * 0];
  dz = yz[1 + 2 * 1] - yz[1 + 2 * 0];
  dp = phi[1] - phi[0];

  /* shift to add first node */
  for (i = (*n) - 1; i >= 0; i--) {
    x[i + 1] = x[i];
    yz[0 + 2 * (i + 1)] = yz[0 + 2 * (i)];
    yz[1 + 2 * (i + 1)] = yz[1 + 2 * (i)];
    phi[(i + 1)] = phi[(i)];
  }
  (*n)++;

  x[0] = x[1] - l;
  yz[0 + 2 * 0] = yz[0 + 2 * 1] - dy * (l / dx);
  yz[1 + 2 * 0] = yz[1 + 2 * 1] - dz * (l / dx);
  phi[0] = phi[1] - dp * (l / dx);

  dx = x[(*n) - 1] - x[(*n) - 2];
  if (ref_math_divisible(l, dx)) {
    x[(*n)] = x[(*n) - 1] + l;

    dy = yz[0 + 2 * ((*n) - 1)] - yz[0 + 2 * ((*n) - 2)];
    yz[0 + 2 * (*n)] = yz[0 + 2 * ((*n) - 1)] + dy * (l / dx);

    dz = yz[1 + 2 * ((*n) - 1)] - yz[1 + 2 * ((*n) - 2)];
    yz[1 + 2 * (*n)] = yz[1 + 2 * ((*n) - 1)] + dz * (l / dx);

    dp = phi[((*n) - 1)] - phi[((*n) - 2)];
    phi[(*n)] = phi[((*n) - 1)] + dp * (l / dx);

    (*n)++;
  }
  return REF_SUCCESS;
}